

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O0

SUNErrCode SUNProfiler_Free(SUNProfiler *p)

{
  _func_void_void_ptr *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((in_RDI != (_func_void_void_ptr *)0x0) && (*(long *)in_RDI != 0)) {
    if (*(long *)in_RDI != 0) {
      SUNHashMap_Destroy((SUNHashMap *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                         ,in_RDI);
      sunTimerStructFree(in_RDI);
      free(*(void **)(*(long *)in_RDI + 8));
      free(*(void **)in_RDI);
    }
    *(long *)in_RDI = 0;
  }
  return 0;
}

Assistant:

SUNErrCode SUNProfiler_Free(SUNProfiler* p)
{
  if (!p || !(*p)) { return SUN_SUCCESS; }

  SUNDIALS_MARK_END(*p, SUNDIALS_ROOT_TIMER);

  if (*p)
  {
    SUNHashMap_Destroy(&(*p)->map, sunTimerStructFree);
    sunTimerStructFree((void*)(*p)->overhead);
#if SUNDIALS_MPI_ENABLED
    if ((*p)->comm != SUN_COMM_NULL) { MPI_Comm_free(&(*p)->comm); }
#endif
    free((*p)->title);
    free(*p);
  }
  *p = NULL;

  return SUN_SUCCESS;
}